

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniDFS.cpp
# Opt level: O2

int __thiscall DataServer::mkdir(DataServer *this,char *__path,__mode_t __mode)

{
  int iVar1;
  string folder;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  string local_28;
  
  std::__cxx11::to_string(&local_28,this->serverId);
  std::operator+(&local_68,"dfsfiles/datanode",&local_28);
  std::operator+(&bStack_88,&local_68,"/");
  std::operator+(&local_48,&bStack_88,&mkdir_path_abi_cxx11_);
  std::__cxx11::string::~string((string *)&bStack_88);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&bStack_88,(string *)&local_48);
  boost::filesystem::create_directories((path *)&bStack_88);
  std::__cxx11::string::~string((string *)&bStack_88);
  iVar1 = std::__cxx11::string::~string((string *)&local_48);
  return iVar1;
}

Assistant:

void mkdir() const
    {
        string folder = "dfsfiles/datanode" + to_string(serverId) + "/" + mkdir_path;
        boost::filesystem::create_directories(folder);
    }